

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  double duration;
  bool bVar1;
  TablePrinter *this_00;
  ostream *poVar2;
  char *pcVar3;
  ColourGuard guard;
  ColourGuard local_30;
  
  pcVar3 = (char *)_sectionStats;
  this_00 = Detail::unique_ptr<Catch::TablePrinter>::operator->(&this->m_tablePrinter);
  TablePrinter::close(this_00,(int)pcVar3);
  if (_sectionStats->missingAssertions == true) {
    lazyPrint(this);
    local_30.m_colourImpl =
         Detail::unique_ptr<Catch::ColourImpl>::operator->
                   (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
    local_30.m_code = BrightRed;
    local_30.m_engaged = false;
    ColourImpl::ColourGuard::engageImpl
              (&local_30,(this->super_StreamingReporterBase).super_ReporterBase.m_stream);
    guard.m_colourImpl = local_30.m_colourImpl;
    guard.m_code = local_30.m_code;
    guard.m_engaged = local_30.m_engaged;
    local_30.m_engaged = false;
    ColourImpl::ColourGuard::~ColourGuard(&local_30);
    pcVar3 = "\nNo assertions in test case";
    if (1 < (ulong)(((long)(this->super_StreamingReporterBase).m_sectionStack.
                           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_StreamingReporterBase).m_sectionStack.
                          super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x30)) {
      pcVar3 = "\nNo assertions in section";
    }
    std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,pcVar3);
    poVar2 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream," \'");
    poVar2 = std::operator<<(poVar2,(string *)_sectionStats);
    pcVar3 = "\'\n\n";
    std::operator<<(poVar2,"\'\n\n");
    std::ostream::flush();
    ColourImpl::ColourGuard::~ColourGuard(&guard);
  }
  duration = _sectionStats->durationInSeconds;
  bVar1 = shouldShowDuration((this->super_StreamingReporterBase).super_ReporterBase.
                             super_IEventListener.m_config,duration);
  if (bVar1) {
    poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    getFormattedDuration_abi_cxx11_((string *)&guard,(Catch *)pcVar3,duration);
    poVar2 = std::operator<<(poVar2,(string *)&guard);
    poVar2 = std::operator<<(poVar2," s: ");
    poVar2 = std::operator<<(poVar2,(string *)_sectionStats);
    std::operator<<(poVar2,'\n');
    std::ostream::flush();
    std::__cxx11::string::~string((string *)&guard);
  }
  if (this->m_headerPrinted == true) {
    this->m_headerPrinted = false;
  }
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::pop_back
            (&(this->super_StreamingReporterBase).m_sectionStack);
  return;
}

Assistant:

void ConsoleReporter::sectionEnded(SectionStats const& _sectionStats) {
    m_tablePrinter->close();
    if (_sectionStats.missingAssertions) {
        lazyPrint();
        auto guard =
            m_colour->guardColour( Colour::ResultError ).engage( m_stream );
        if (m_sectionStack.size() > 1)
            m_stream << "\nNo assertions in section";
        else
            m_stream << "\nNo assertions in test case";
        m_stream << " '" << _sectionStats.sectionInfo.name << "'\n\n" << std::flush;
    }
    double dur = _sectionStats.durationInSeconds;
    if (shouldShowDuration(*m_config, dur)) {
        m_stream << getFormattedDuration(dur) << " s: " << _sectionStats.sectionInfo.name << '\n' << std::flush;
    }
    if (m_headerPrinted) {
        m_headerPrinted = false;
    }
    StreamingReporterBase::sectionEnded(_sectionStats);
}